

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprites.cpp
# Opt level: O0

uint64_t anon_unknown.dwarf_6bd751::expand_sprite_word(uint16_t source)

{
  ulong uVar1;
  uint64_t result;
  uint16_t source_local;
  
  uVar1 = ((ulong)source | (ulong)source << 0x18) & 0xff000000ff;
  uVar1 = (uVar1 | uVar1 << 0xc) & 0xf000f000f000f;
  uVar1 = (uVar1 | uVar1 << 6) & 0x303030303030303;
  return (uVar1 | uVar1 << 3) & 0x1111111111111111;
}

Assistant:

constexpr uint64_t expand_sprite_word(uint16_t source) {
	uint64_t result = source;
	result = (result | (result << 24)) & 0x0000'00ff'0000'00ff;
	result = (result | (result << 12)) & 0x000f'000f'000f'000f;
	result = (result | (result << 6)) & 0x0303'0303'0303'0303;
	result = (result | (result << 3)) & 0x1111'1111'1111'1111;
	return result;
}